

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

bool Js::DynamicTypeHandler::CheckHeuristicsForFixedDataProps
               (DynamicObject *instance,PropertyRecord *propertyRecord,Var value)

{
  bool bVar1;
  byte bVar2;
  PropertyId PVar3;
  TypeId TVar4;
  uint uVar5;
  ScriptContext *pSVar6;
  DynamicTypeHandler *this;
  Type *this_00;
  RootObjectInlineCache *this_01;
  uint refCount;
  RootObjectInlineCache *cache;
  Var value_local;
  PropertyRecord *propertyRecord_local;
  DynamicObject *instance_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,FixDataPropsPhase);
  if (bVar1) {
    return true;
  }
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    TVar4 = RecyclableObject::GetTypeId(&instance->super_RecyclableObject);
    if (TVar4 == TypeIds_GlobalObject) {
      pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      PVar3 = PropertyRecord::GetPropertyId(propertyRecord);
      bVar1 = ScriptContext::IsIntConstPropertyOnGlobalObject(pSVar6,PVar3);
      if (bVar1) {
        return true;
      }
    }
    TVar4 = RecyclableObject::GetTypeId(&instance->super_RecyclableObject);
    if (TVar4 == TypeIds_Object) {
      pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      PVar3 = PropertyRecord::GetPropertyId(propertyRecord);
      bVar1 = ScriptContext::IsIntConstPropertyOnGlobalUserObject(pSVar6,PVar3);
      if (bVar1) {
        return true;
      }
    }
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,FixDataVarPropsPhase);
  if (bVar1) {
    this = DynamicObject::GetTypeHandler(instance);
    bVar2 = GetFlags(this);
    if ((bVar2 & 0x20) != 0) {
      return true;
    }
    this_00 = RecyclableObject::GetType(&instance->super_RecyclableObject);
    TVar4 = Js::Type::GetTypeId(this_00);
    if (TVar4 == TypeIds_GlobalObject) {
      this_01 = RootObjectBase::GetRootInlineCache
                          ((RootObjectBase *)instance,propertyRecord,false,true);
      uVar5 = RootObjectInlineCache::Release(this_01);
      return uVar5 < 2;
    }
  }
  return false;
}

Assistant:

bool DynamicTypeHandler::CheckHeuristicsForFixedDataProps(DynamicObject* instance, const PropertyRecord * propertyRecord, Var value)
    {
        if (PHASE_FORCE1(Js::FixDataPropsPhase))
        {
            return true;
        }

        if (Js::TaggedInt::Is(value) &&
            ((instance->GetTypeId() == TypeIds_GlobalObject && instance->GetScriptContext()->IsIntConstPropertyOnGlobalObject(propertyRecord->GetPropertyId())) ||
            (instance->GetTypeId() == TypeIds_Object && instance->GetScriptContext()->IsIntConstPropertyOnGlobalUserObject(propertyRecord->GetPropertyId()))))
        {
            return true;
        }

        // Disabled by default
        if (PHASE_ON1(Js::FixDataVarPropsPhase))
        {
            if (instance->GetTypeHandler()->GetFlags() & IsPrototypeFlag)
            {
                return true;
            }
            if (instance->GetType()->GetTypeId() == TypeIds_GlobalObject)
            {
                // if we have statically seen multiple stores - we should not do this optimization
                RootObjectInlineCache* cache = (static_cast<Js::RootObjectBase*>(instance))->GetRootInlineCache(propertyRecord, /*isLoadMethod*/ false, /*isStore*/ true);
                uint refCount = cache->Release();
                return refCount <= 1;
            }
        }
        return false;
    }